

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::Clipper::AddJoin(Clipper *this,TEdge *e1,TEdge *e2,int e1OutIdx,int e2OutIdx)

{
  JoinRec *this_00;
  IntPoint local_80;
  IntPoint local_70;
  IntPoint local_60;
  IntPoint local_50 [2];
  JoinRec *local_30;
  JoinRec *jr;
  int e2OutIdx_local;
  int e1OutIdx_local;
  TEdge *e2_local;
  TEdge *e1_local;
  Clipper *this_local;
  
  jr._0_4_ = e2OutIdx;
  jr._4_4_ = e1OutIdx;
  _e2OutIdx_local = e2;
  e2_local = e1;
  e1_local = (TEdge *)this;
  this_00 = (JoinRec *)operator_new(0x50);
  JoinRec::JoinRec(this_00);
  if (jr._4_4_ < 0) {
    this_00->poly1Idx = e2_local->outIdx;
  }
  else {
    this_00->poly1Idx = jr._4_4_;
  }
  local_30 = this_00;
  IntPoint::IntPoint(local_50,e2_local->xcurr,e2_local->ycurr);
  (local_30->pt1a).X = local_50[0].X;
  (local_30->pt1a).Y = local_50[0].Y;
  IntPoint::IntPoint(&local_60,e2_local->xtop,e2_local->ytop);
  (local_30->pt1b).X = local_60.X;
  (local_30->pt1b).Y = local_60.Y;
  if ((int)jr < 0) {
    local_30->poly2Idx = _e2OutIdx_local->outIdx;
  }
  else {
    local_30->poly2Idx = (int)jr;
  }
  IntPoint::IntPoint(&local_70,_e2OutIdx_local->xcurr,_e2OutIdx_local->ycurr);
  (local_30->pt2a).X = local_70.X;
  (local_30->pt2a).Y = local_70.Y;
  IntPoint::IntPoint(&local_80,_e2OutIdx_local->xtop,_e2OutIdx_local->ytop);
  (local_30->pt2b).X = local_80.X;
  (local_30->pt2b).Y = local_80.Y;
  std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::push_back
            (&this->m_Joins,&local_30);
  return;
}

Assistant:

void Clipper::AddJoin(TEdge *e1, TEdge *e2, int e1OutIdx, int e2OutIdx)
{
  JoinRec* jr = new JoinRec;
  if (e1OutIdx >= 0)
    jr->poly1Idx = e1OutIdx; else
    jr->poly1Idx = e1->outIdx;
  jr->pt1a = IntPoint(e1->xcurr, e1->ycurr);
  jr->pt1b = IntPoint(e1->xtop, e1->ytop);
  if (e2OutIdx >= 0)
    jr->poly2Idx = e2OutIdx; else
    jr->poly2Idx = e2->outIdx;
  jr->pt2a = IntPoint(e2->xcurr, e2->ycurr);
  jr->pt2b = IntPoint(e2->xtop, e2->ytop);
  m_Joins.push_back(jr);
}